

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O2

void __thiscall dap::any::alloc(any *this,size_t size,size_t align)

{
  uintptr_t addr;
  void *pvVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  if (this->value == (void *)0x0) {
    puVar2 = this->buffer + (align - 1);
    puVar2 = puVar2 + -((ulong)puVar2 % align);
    this->value = puVar2;
    if ((any *)(puVar2 + (size - 1)) < this->buffer || this + 1 <= (any *)(puVar2 + (size - 1))) {
      pvVar1 = operator_new__(size + align);
      this->heap = pvVar1;
      uVar3 = (align - 1) + (long)pvVar1;
      this->value = (void *)(uVar3 - uVar3 % align);
    }
    return;
  }
  __assert_fail("value == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                ,0xb9,"void dap::any::alloc(size_t, size_t)");
}

Assistant:

void any::alloc(size_t size, size_t align) {
  assert(value == nullptr);
  value = alignUp(buffer, align);
  if (isInBuffer(reinterpret_cast<uint8_t*>(value) + size - 1)) {
    return;
  }
  heap = new uint8_t[size + align];
  value = alignUp(heap, align);
}